

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O1

void __thiscall
google::protobuf::RepeatedField<unsigned_int>::UnsafeArenaSwap
          (RepeatedField<unsigned_int> *this,RepeatedField<unsigned_int> *other)

{
  anon_union_8_2_a06a818b_for_HeapRep<8UL>_1 v1;
  anon_union_8_2_a06a818b_for_HeapRep<8UL>_1 v2;
  anon_union_8_2_a06a818b_for_HeapRep<8UL>_1 *paVar1;
  Nonnull<const_char_*> pcVar2;
  
  if (this == other) {
    return;
  }
  if ((undefined1  [16])((undefined1  [16])(this->soo_rep_).field_0 & (undefined1  [16])0x4) ==
      (undefined1  [16])0x0) {
    v1.arena = internal::SooRep::soo_arena(&this->soo_rep_);
  }
  else {
    paVar1 = &heap_rep(this)->field_0;
    v1 = (anon_union_8_2_a06a818b_for_HeapRep<8UL>_1)paVar1->arena;
  }
  if ((undefined1  [16])((undefined1  [16])(other->soo_rep_).field_0 & (undefined1  [16])0x4) ==
      (undefined1  [16])0x0) {
    v2.arena = internal::SooRep::soo_arena(&other->soo_rep_);
  }
  else {
    paVar1 = &heap_rep(other)->field_0;
    v2 = (anon_union_8_2_a06a818b_for_HeapRep<8UL>_1)paVar1->arena;
  }
  if (v1.arena == v2.arena) {
    pcVar2 = (Nonnull<const_char_*>)0x0;
  }
  else {
    pcVar2 = absl::lts_20250127::log_internal::MakeCheckOpString<void_const*,void_const*>
                       (v1.arena,v2.arena,"GetArena() == other->GetArena()");
  }
  if (pcVar2 == (Nonnull<const_char_*>)0x0) {
    InternalSwap(this,other);
    return;
  }
  UnsafeArenaSwap();
}

Assistant:

void RepeatedField<Element>::UnsafeArenaSwap(RepeatedField* other) {
  if (this == other) return;
  ABSL_DCHECK_EQ(GetArena(), other->GetArena());
  InternalSwap(other);
}